

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_cases.h
# Opt level: O2

bool date::cases_reader_t<2ul,2ul>::
     read<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
               *fmt)

{
  bool bVar1;
  bool bVar2;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> local_48;
  
  local_48.m_srcIt = pos->m_srcIt;
  local_48.m_srcEnd = pos->m_srcEnd;
  local_48.m_cache = pos->m_cache;
  local_48.m_cacheSize = pos->m_cacheSize;
  local_48.m_position = pos->m_position;
  bVar1 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,4ul,short,11ul>
                    (pos,end,(aliases_t<char,_4UL,_short,_11UL> *)
                             &(fmt->branches).
                              super__Tuple_impl<0UL,_date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
                              .
                              super__Head_base<0UL,_date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_false>
                    );
  bVar2 = true;
  if (!bVar1) {
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator=
              (pos,&local_48);
    bVar2 = cases_reader_t<2ul,1ul>::
            read<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>
                      (pos,end,fmt);
  }
  return bVar2;
}

Assistant:

static bool read(Iterator& pos, const Iterator& end, cases_t<Branches...>& fmt)
    {
        Iterator begin = pos;
        if (read_impl(pos, end, std::get<Count - N>(fmt.branches)))
            return true;
        
        pos = std::move(begin);
        return cases_reader_t<Count, N - 1>::read(pos, end, fmt);
    }